

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGraphValidator.cpp
# Opt level: O1

set<const_dg::pta::PSNode_*,_std::less<const_dg::pta::PSNode_*>,_std::allocator<const_dg::pta::PSNode_*>_>
* dg::pta::reachableNodes(PSNode *nd)

{
  pointer ppPVar1;
  pointer ppPVar2;
  PSNode **ppPVar3;
  iterator iVar4;
  PSNode **ppPVar5;
  vector<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_> *__range3;
  pointer ppPVar6;
  PSNode *in_RSI;
  _Rb_tree<dg::pta::PSNode_const*,dg::pta::PSNode_const*,std::_Identity<dg::pta::PSNode_const*>,std::less<dg::pta::PSNode_const*>,std::allocator<dg::pta::PSNode_const*>>
  *in_RDI;
  pointer ppPVar7;
  pair<std::_Rb_tree_iterator<const_dg::pta::PSNode_*>,_bool> pVar8;
  PSNode *succ;
  vector<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_> local_88;
  PSNode **local_68;
  iterator iStack_60;
  PSNode **local_58;
  PSNode *local_48;
  PSNode *local_40;
  PSNode **local_38;
  
  *(undefined4 *)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  *(_Rb_tree<dg::pta::PSNode_const*,dg::pta::PSNode_const*,std::_Identity<dg::pta::PSNode_const*>,std::less<dg::pta::PSNode_const*>,std::allocator<dg::pta::PSNode_const*>>
    **)(in_RDI + 0x18) = in_RDI + 8;
  *(_Rb_tree<dg::pta::PSNode_const*,dg::pta::PSNode_const*,std::_Identity<dg::pta::PSNode_const*>,std::less<dg::pta::PSNode_const*>,std::allocator<dg::pta::PSNode_const*>>
    **)(in_RDI + 0x20) = in_RDI + 8;
  *(undefined8 *)(in_RDI + 0x28) = 0;
  local_40 = in_RSI;
  std::
  _Rb_tree<dg::pta::PSNode_const*,dg::pta::PSNode_const*,std::_Identity<dg::pta::PSNode_const*>,std::less<dg::pta::PSNode_const*>,std::allocator<dg::pta::PSNode_const*>>
  ::_M_insert_unique<dg::pta::PSNode_const*const&>(in_RDI,&local_40);
  local_88.super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (PSNode **)0x0;
  local_88.super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (PSNode **)0x0;
  local_88.super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (PSNode **)0x0;
  std::vector<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>::reserve
            (&local_88,4);
  if (local_88.super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_88.super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<dg::pta::PSNode_const*,std::allocator<dg::pta::PSNode_const*>>::
    _M_realloc_insert<dg::pta::PSNode_const*const&>
              ((vector<dg::pta::PSNode_const*,std::allocator<dg::pta::PSNode_const*>> *)&local_88,
               (iterator)
               local_88.
               super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>
               ._M_impl.super__Vector_impl_data._M_finish,&local_40);
  }
  else {
    *local_88.super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>.
     _M_impl.super__Vector_impl_data._M_finish = local_40;
    local_88.super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_88.
         super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>.
         _M_impl.super__Vector_impl_data._M_finish + 1;
  }
  if (local_88.super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_88.super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      local_68 = (PSNode **)0x0;
      iStack_60._M_current = (PSNode **)0x0;
      local_58 = (PSNode **)0x0;
      std::vector<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>::reserve
                ((vector<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_> *)
                 &local_68,
                 (long)local_88.
                       super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_88.
                       super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3);
      local_38 = local_88.
                 super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      ppPVar7 = local_88.
                super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (local_88.
          super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          local_88.
          super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        do {
          ppPVar1 = ((*ppPVar7)->super_SubgraphNode<dg::pta::PSNode>)._successors.
                    super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          for (ppPVar6 = ((*ppPVar7)->super_SubgraphNode<dg::pta::PSNode>)._successors.
                         super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
                         _M_impl.super__Vector_impl_data._M_start; ppPVar6 != ppPVar1;
              ppPVar6 = ppPVar6 + 1) {
            local_48 = *ppPVar6;
            pVar8 = std::
                    _Rb_tree<dg::pta::PSNode_const*,dg::pta::PSNode_const*,std::_Identity<dg::pta::PSNode_const*>,std::less<dg::pta::PSNode_const*>,std::allocator<dg::pta::PSNode_const*>>
                    ::_M_insert_unique<dg::pta::PSNode_const*const&>(in_RDI,&local_48);
            if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              if (iStack_60._M_current == local_58) {
                std::vector<dg::pta::PSNode_const*,std::allocator<dg::pta::PSNode_const*>>::
                _M_realloc_insert<dg::pta::PSNode_const*const&>
                          ((vector<dg::pta::PSNode_const*,std::allocator<dg::pta::PSNode_const*>> *)
                           &local_68,iStack_60,&local_48);
              }
              else {
                *iStack_60._M_current = local_48;
                iStack_60._M_current = iStack_60._M_current + 1;
              }
            }
          }
          ppPVar7 = ppPVar7 + 1;
        } while (ppPVar7 != local_38);
      }
      ppPVar5 = local_58;
      iVar4._M_current = iStack_60._M_current;
      ppPVar3 = local_68;
      ppPVar2 = local_88.
                super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      ppPVar7 = local_88.
                super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_58 = local_88.
                 super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_68 = local_88.
                 super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      iStack_60._M_current =
           local_88.
           super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      local_88.super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>
      ._M_impl.super__Vector_impl_data._M_start = ppPVar3;
      local_88.super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = iVar4._M_current;
      local_88.super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = ppPVar5;
      if (ppPVar7 != (PSNode **)0x0) {
        operator_delete(ppPVar7,(long)ppPVar2 - (long)ppPVar7);
      }
    } while (local_88.
             super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>.
             _M_impl.super__Vector_impl_data._M_start !=
             local_88.
             super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_88.super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (PSNode **)0x0) {
    operator_delete(local_88.
                    super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.
                          super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.
                          super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return (set<const_dg::pta::PSNode_*,_std::less<const_dg::pta::PSNode_*>,_std::allocator<const_dg::pta::PSNode_*>_>
          *)in_RDI;
}

Assistant:

std::set<const PSNode *> reachableNodes(const PSNode *nd) {
    std::set<const PSNode *> reachable;
    reachable.insert(nd);

    std::vector<const PSNode *> to_process;
    to_process.reserve(4);
    to_process.push_back(nd);

    while (!to_process.empty()) {
        std::vector<const PSNode *> new_to_process;
        new_to_process.reserve(to_process.size());

        for (const PSNode *cur : to_process) {
            for (const PSNode *succ : cur->successors()) {
                if (reachable.insert(succ).second)
                    new_to_process.push_back(succ);
            }
        }

        new_to_process.swap(to_process);
    }

    return reachable;
}